

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

string * __thiscall Matrix::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,Matrix *this)

{
  string *psVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  char cVar5;
  long lVar6;
  ostringstream out;
  string local_1d8;
  string *local_1b8;
  ulong local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\begin{bmatrix}",0xf);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  cVar5 = (char)(ostream *)local_1a8;
  std::ostream::put(cVar5);
  std::ostream::flush();
  uVar4 = 0;
  local_1b8 = __return_storage_ptr__;
  while (uVar2 = this->n_, (long)uVar4 < (long)(int)uVar2) {
    if (0 < this->m_) {
      lVar6 = 0;
      uVar3 = 0;
      local_1b0 = uVar4;
      do {
        Fraction::ToLaTex_abi_cxx11_
                  (&local_1d8,
                   (Fraction *)
                   (*(long *)&(this->elements_).
                              super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar4].
                              super__Vector_base<Fraction,_std::allocator<Fraction>_>._M_impl.
                              super__Vector_impl_data + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        uVar3 = uVar3 + 1;
        uVar2 = this->m_;
        if (uVar3 != uVar2) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," & ",3);
          uVar2 = this->m_;
        }
        lVar6 = lVar6 + 8;
      } while ((long)uVar3 < (long)(int)uVar2);
      uVar2 = this->n_;
      uVar4 = local_1b0;
    }
    uVar4 = uVar4 + 1;
    if (uVar4 != uVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," \\\\",3);
    }
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\\end{bmatrix}",0xd);
  psVar1 = local_1b8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string Matrix::ToLaTex() const {
  std::ostringstream out;
  out << "\\begin{bmatrix}" << std::endl;
  for (int i = 0; i < n_; ++i) {
    for (int j = 0; j < m_; ++j) {
      out << elements_[i][j].ToLaTex();
      if (j + 1 != m_) {
        out << " & ";
      }
    }
    if (i + 1 != n_) {
      out << " \\\\";
    }
    out << std::endl;
  }
  out << "\\end{bmatrix}";

  return out.str();
}